

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  long lVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  long *plVar5;
  ostream *poVar6;
  uint uVar7;
  int iVar8;
  uint8_t value;
  ofstream outFile;
  ifstream inFile;
  undefined1 auStack_448 [15];
  undefined1 local_439;
  long local_438;
  filebuf local_430 [8];
  undefined8 uStack_428;
  uint auStack_420 [50];
  char acStack_358 [24];
  ios_base local_340 [264];
  char local_238 [520];
  
  std::ifstream::ifstream(local_238,argv[1],_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  iVar8 = 1;
  if (cVar2 != '\0') {
    std::ofstream::ofstream(&local_438,argv[2],_S_out);
    cVar2 = std::__basic_file<char>::is_open();
    iVar8 = 1;
    if (cVar2 != '\0') {
      *(uint *)((long)auStack_420 + *(long *)(local_438 + -0x18)) =
           *(uint *)((long)auStack_420 + *(long *)(local_438 + -0x18)) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_438,"#include <vector>\n\n",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_438,"const std::vector<std::uint8_t> ",0x20);
      __s = argv[3];
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_448 + (int)*(undefined8 *)(local_438 + -0x18) + 0x10);
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438," = {",4);
      local_439 = 0;
      iVar8 = 0;
      while( true ) {
        plVar5 = (long *)std::istream::get(local_238);
        if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
        if (iVar8 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"\n\t",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"0x",2);
        *(undefined8 *)((long)&uStack_428 + *(long *)(local_438 + -0x18)) = 2;
        lVar1 = *(long *)(local_438 + -0x18);
        if (acStack_358[lVar1 + 1] == '\0') {
          cVar2 = std::ios::widen((char)auStack_448 + (char)lVar1 + '\x10');
          acStack_358[lVar1] = cVar2;
          acStack_358[lVar1 + 1] = '\x01';
        }
        acStack_358[lVar1] = '0';
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
        uVar7 = iVar8 + 1;
        uVar3 = iVar8 + 0x20;
        if (-1 < (int)uVar7) {
          uVar3 = uVar7;
        }
        iVar8 = uVar7 - (uVar3 & 0xffffffe0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"\n};\n",4);
      iVar8 = 0;
    }
    local_438 = _VTT;
    *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _ofstream;
    std::filebuf::~filebuf(local_430);
    std::ios_base::~ios_base(local_340);
  }
  std::ifstream::~ifstream(local_238);
  return iVar8;
}

Assistant:

int main(int argc, char* argv[])
{
	const int rowLength = 32;

	std::ifstream inFile(argv[1], std::ios::binary);
	if (!inFile.is_open()) return EXIT_FAILURE;

	std::ofstream outFile(argv[2]);
	if (!outFile.is_open()) return EXIT_FAILURE;

	outFile << std::hex;
	outFile << "#include <vector>\n\n";
	outFile << "const std::vector<std::uint8_t> " << argv[3] << " = {";

	std::uint8_t value = 0;
	int rowCount = 0;

	while (inFile.get(reinterpret_cast<char&>(value)))
	{
		if (rowCount++ == 0)
		{
			outFile << "\n\t";
		}

		outFile << "0x" << std::setw(2) << std::setfill('0') << static_cast<std::uint32_t>(value) << ",";

		rowCount %= rowLength;
	}

	outFile << "\n};\n";

	return EXIT_SUCCESS;
}